

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

uint Kit_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  ushort *puVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint *pIn;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  int pStore [32];
  int local_b8 [34];
  
  uVar3 = 1 << ((byte)nVars - 5 & 0x1f);
  if (nVars < 6) {
    uVar3 = 1;
  }
  if (0 < nVars) {
    uVar5 = 0;
    do {
      pCanonPerm[uVar5] = (char)uVar5;
      uVar5 = uVar5 + 1;
    } while ((uint)nVars != uVar5);
  }
  uVar9 = 0;
  uVar5 = (ulong)uVar3;
  iVar8 = 0;
  if (0 < (int)uVar3) {
    lVar6 = uVar5 + 1;
    iVar8 = 0;
    do {
      uVar7 = (pInOut[lVar6 + -2] >> 1 & 0x55555555) + (pInOut[lVar6 + -2] & 0x55555555);
      uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
      uVar7 = (uVar7 >> 4 & 0x7070707) + (uVar7 & 0x7070707);
      uVar7 = (uVar7 >> 8 & 0xf000f) + (uVar7 & 0xf000f);
      iVar8 = (uVar7 >> 0x10) + iVar8 + (uVar7 & 0xffff);
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  if ((iVar8 != uVar3 * 0x10 && SBORROW4(iVar8,uVar3 * 0x10) == (int)(iVar8 + uVar3 * -0x10) < 0) &&
     (uVar9 = 1 << ((byte)nVars & 0x1f), 0 < (int)uVar3)) {
    lVar6 = uVar5 + 1;
    do {
      pInOut[lVar6 + -2] = ~pInOut[lVar6 + -2];
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  Kit_TruthCountOnesInCofs(pInOut,nVars,local_b8);
  if (0 < nVars) {
    uVar11 = 0;
    do {
      iVar8 = local_b8[uVar11 * 2];
      if (iVar8 < local_b8[uVar11 * 2 + 1]) {
        uVar9 = uVar9 | 1 << ((uint)uVar11 & 0x1f);
        local_b8[uVar11 * 2] = local_b8[uVar11 * 2 + 1];
        local_b8[uVar11 * 2 + 1] = iVar8;
        Kit_TruthChangePhase(pInOut,nVars,(uint)uVar11);
      }
      uVar11 = uVar11 + 1;
    } while ((uint)nVars != uVar11);
  }
  bVar12 = false;
  do {
    bVar4 = true;
    if (1 < nVars) {
      uVar11 = 0;
      bVar4 = false;
      pIn = pInOut;
      do {
        iVar8 = local_b8[uVar11 * 2];
        iVar2 = local_b8[uVar11 * 2 + 2];
        pInOut = pIn;
        if (iVar8 < iVar2) {
          puVar1 = (ushort *)(pCanonPerm + uVar11);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          local_b8[uVar11 * 2] = iVar2;
          local_b8[uVar11 * 2 + 2] = iVar8;
          iVar8 = local_b8[uVar11 * 2 + 1];
          uVar10 = uVar9 >> ((byte)uVar11 & 0x1f);
          local_b8[uVar11 * 2 + 1] = local_b8[uVar11 * 2 + 3];
          local_b8[uVar11 * 2 + 3] = iVar8;
          uVar7 = 0;
          if ((((uVar10 & 2) == 0 ^ (byte)uVar10) & 1) == 0) {
            uVar7 = 3 << ((byte)uVar11 & 0x1f);
          }
          bVar12 = (bool)(bVar12 ^ 1);
          uVar9 = uVar9 ^ uVar7;
          Kit_TruthSwapAdjacentVars(pAux,pIn,nVars,(int)uVar11);
          bVar4 = true;
          pInOut = pAux;
          pAux = pIn;
        }
        uVar11 = uVar11 + 1;
        pIn = pInOut;
      } while (nVars - 1 != uVar11);
      bVar4 = !bVar4;
    }
  } while (!bVar4);
  if ((0 < (int)uVar3) && (bVar12)) {
    lVar6 = uVar5 + 1;
    do {
      pAux[lVar6 + -2] = pInOut[lVar6 + -2];
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  return uVar9;
}

Assistant:

unsigned Kit_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    int pStore[32];
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Kit_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    nOnes = Kit_TruthCountOnes(pIn, nVars);
    //if(pIn[0] & 1)
    if ( (nOnes > nWords * 16) )//|| ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Kit_TruthCountOnesInCofs( pIn, nVars, pStore );
/*
    Kit_TruthCountOnesInCofsSlow( pIn, nVars, pStore2, pAux );
    for ( i = 0; i < 2*nVars; i++ )
    {
        assert( pStore[i] == pStore2[i] );
    }
*/
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] >= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Kit_TruthChangePhase( pIn, nVars, i );
    }

//    Kit_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] >= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );


/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Kit_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Kit_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Kit_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Kit_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}